

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

char * telopt(int opt)

{
  char *pcStack_10;
  int opt_local;
  
  switch(opt) {
  case 0:
    pcStack_10 = "BINARY";
    break;
  case 1:
    pcStack_10 = "ECHO";
    break;
  case 2:
    pcStack_10 = "RCP";
    break;
  case 3:
    pcStack_10 = "SGA";
    break;
  case 4:
    pcStack_10 = "NAMS";
    break;
  case 5:
    pcStack_10 = "STATUS";
    break;
  case 6:
    pcStack_10 = "TM";
    break;
  case 7:
    pcStack_10 = "RCTE";
    break;
  case 8:
    pcStack_10 = "NAOL";
    break;
  case 9:
    pcStack_10 = "NAOP";
    break;
  case 10:
    pcStack_10 = "NAOCRD";
    break;
  case 0xb:
    pcStack_10 = "NAOHTS";
    break;
  case 0xc:
    pcStack_10 = "NAOHTD";
    break;
  case 0xd:
    pcStack_10 = "NAOFFD";
    break;
  case 0xe:
    pcStack_10 = "NAOVTS";
    break;
  case 0xf:
    pcStack_10 = "NAOVTD";
    break;
  case 0x10:
    pcStack_10 = "NAOLFD";
    break;
  case 0x11:
    pcStack_10 = "XASCII";
    break;
  case 0x12:
    pcStack_10 = "LOGOUT";
    break;
  case 0x13:
    pcStack_10 = "BM";
    break;
  case 0x14:
    pcStack_10 = "DET";
    break;
  case 0x15:
    pcStack_10 = "SUPDUP";
    break;
  case 0x16:
    pcStack_10 = "SUPDUPOUTPUT";
    break;
  case 0x17:
    pcStack_10 = "SNDLOC";
    break;
  case 0x18:
    pcStack_10 = "TTYPE";
    break;
  case 0x19:
    pcStack_10 = "EOR";
    break;
  case 0x1a:
    pcStack_10 = "TUID";
    break;
  case 0x1b:
    pcStack_10 = "OUTMRK";
    break;
  case 0x1c:
    pcStack_10 = "TTYLOC";
    break;
  case 0x1d:
    pcStack_10 = "3270REGIME";
    break;
  case 0x1e:
    pcStack_10 = "X3PAD";
    break;
  case 0x1f:
    pcStack_10 = "NAWS";
    break;
  case 0x20:
    pcStack_10 = "TSPEED";
    break;
  case 0x21:
    pcStack_10 = "LFLOW";
    break;
  case 0x22:
    pcStack_10 = "LINEMODE";
    break;
  case 0x23:
    pcStack_10 = "XDISPLOC";
    break;
  case 0x24:
    pcStack_10 = "OLD_ENVIRON";
    break;
  case 0x25:
    pcStack_10 = "AUTHENTICATION";
    break;
  case 0x26:
    pcStack_10 = "ENCRYPT";
    break;
  case 0x27:
    pcStack_10 = "NEW_ENVIRON";
    break;
  case 0x28:
    pcStack_10 = "TN3270E";
    break;
  case 0x29:
    pcStack_10 = "XAUTH";
    break;
  case 0x2a:
    pcStack_10 = "CHARSET";
    break;
  case 0x2b:
    pcStack_10 = "RSP";
    break;
  case 0x2c:
    pcStack_10 = "COM_PORT_OPTION";
    break;
  case 0x2d:
    pcStack_10 = "SLE";
    break;
  case 0x2e:
    pcStack_10 = "STARTTLS";
    break;
  case 0x2f:
    pcStack_10 = "KERMIT";
    break;
  case 0x30:
    pcStack_10 = "SEND_URL";
    break;
  case 0x31:
    pcStack_10 = "FORWARD_X";
    break;
  default:
    pcStack_10 = "<unknown>";
    break;
  case 0x8a:
    pcStack_10 = "PRAGMA_LOGON";
    break;
  case 0x8b:
    pcStack_10 = "SSPI_LOGON";
    break;
  case 0x8c:
    pcStack_10 = "PRAGMA_HEARTBEAT";
    break;
  case 0xff:
    pcStack_10 = "EXOPL";
  }
  return pcStack_10;
}

Assistant:

static const char *telopt(int opt)
{
#define telnet_str(x,y) case TELOPT_##x: return #x;
    switch (opt) {
        TELOPTS(telnet_str)
      default:
        return "<unknown>";
    }
#undef telnet_str
}